

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O3

void __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::ScanNewLine
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,uint ch)

{
  OLECHAR OVar1;
  
  if (ch == 0xd) {
    OVar1 = PeekNextChar(this);
    if (OVar1 == L'\n') {
      UTF8EncodingPolicyBase<false>::ReadFull<true>
                (&this->super_UTF8EncodingPolicyBase<false>,&this->m_currentCharacter,
                 this->m_pchLast);
    }
  }
  this->m_line = this->m_line + 1;
  this->m_pchPrevLine = this->m_pchMinLine;
  this->m_pchMinLine = this->m_currentCharacter;
  this->m_cMinLineMultiUnits = (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits;
  return;
}

Assistant:

void Scanner<EncodingPolicy>::ScanNewLine(uint ch)
{
    if (ch == '\r' && PeekNextChar() == '\n')
    {
        ReadNextChar();
    }

    NotifyScannedNewLine();
}